

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

Vector3 * __thiscall
iDynTree::KinDynComputations::getCenterOfMassVelocity
          (Vector3 *__return_storage_ptr__,KinDynComputations *this)

{
  SpatialMomentum m_totalMomentum_in_com_inertial;
  Position com_in_inertial;
  Transform aTStack_138 [8];
  undefined1 local_130 [48];
  Position local_100 [24];
  KinDynComputations local_e8;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_d0 [4];
  undefined1 *local_88 [3];
  scalar_constant_op<double> local_70;
  
  computeRawMassMatrixAndTotalMomentum(this);
  getCenterOfMassPosition(&local_e8);
  iDynTree::Rotation::Identity();
  iDynTree::Position::operator-(local_100);
  iDynTree::Transform::Transform((Transform *)local_88,(Rotation *)local_d0,local_100);
  iDynTree::Transform::operator*(aTStack_138,(SpatialMomentum *)local_88);
  KinDynComputationsPrivateAttributes::getRobotLockedInertia(this->pimpl);
  local_70.m_other = (double)iDynTree::SpatialInertia::getMass();
  local_88[0] = local_130;
  local_d0[0]._0_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_d0,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)local_88);
  iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)aTStack_138);
  return __return_storage_ptr__;
}

Assistant:

Vector3 KinDynComputations::getCenterOfMassVelocity()
{
    this->computeRawMassMatrixAndTotalMomentum();

    // We exploit the structure of the cached total momentum to the the com velocity
    Position com_in_inertial = this->getCenterOfMassPosition();

    // Express the total momentum with the orientation of the inertial frame but in the center of mass
    SpatialMomentum m_totalMomentum_in_com_inertial = Transform(Rotation::Identity(),-com_in_inertial)*this->pimpl->m_totalMomentum;

    // The com velocity is just the linear part divided by the total mass
    double total_mass = pimpl->getRobotLockedInertia().getMass();

    Vector3 com_vel;
    toEigen(com_vel) = toEigen(m_totalMomentum_in_com_inertial.getLinearVec3())/total_mass;

    return com_vel;
}